

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O1

void discrete_dist_test_chi2_test<trng::zero_truncated_poisson_dist>(zero_truncated_poisson_dist *d)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double *__src;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int iVar8;
  long lVar9;
  double dVar10;
  parameter_type P;
  vector<double,_std::allocator<double>_> p;
  vector<int,_std::allocator<int>_> count;
  AssertionHandler catchAssertionHandler;
  lcg64_shift R;
  vector<double,_std::allocator<double>_> local_f8;
  vector<int,_std::allocator<int>_> local_e0;
  double local_c8;
  AssertionHandler local_b8;
  StringRef local_70;
  lcg64_shift local_60;
  StringRef local_48;
  SourceLineInfo local_38;
  
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  iVar8 = 0;
  iVar4 = 1;
  do {
    local_b8.m_assertionInfo.macroName.m_start =
         (char *)trng::zero_truncated_poisson_dist::pdf(d,iVar4);
    if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish ==
        local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&local_f8,
                 (iterator)
                 local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(double *)&local_b8);
    }
    else {
      *local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish = (double)local_b8.m_assertionInfo.macroName.m_start;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    dVar10 = trng::zero_truncated_poisson_dist::cdf(d,iVar4);
    iVar8 = iVar8 + -1;
    iVar4 = iVar4 + 1;
  } while (dVar10 <= 0.99);
  if ((dVar10 <= 0.99) + 0x80000001 != iVar8) {
    dVar10 = trng::zero_truncated_poisson_dist::cdf(d,(uint)(dVar10 <= 0.99) - iVar8);
    local_b8.m_assertionInfo.macroName.m_start = (char *)(1.0 - dVar10);
    if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish ==
        local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&local_f8,
                 (iterator)
                 local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(double *)&local_b8);
    }
    else {
      *local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish = (double)local_b8.m_assertionInfo.macroName.m_start;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
  }
  iVar8 = (int)((ulong)((long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3);
  local_b8.m_assertionInfo.macroName.m_start =
       (char *)((ulong)local_b8.m_assertionInfo.macroName.m_start & 0xffffffff00000000);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_e0,(long)iVar8,(value_type_conflict *)&local_b8,(allocator_type *)&local_60);
  P.b = 1;
  P.a = 0xfbd19fbbc5c07ff5;
  trng::lcg64_shift::lcg64_shift(&local_60,100,P);
  iVar8 = iVar8 + -1;
  iVar4 = 10000;
  do {
    iVar2 = trng::zero_truncated_poisson_dist::operator()(d,&local_60);
    iVar3 = iVar2 + -1;
    if (iVar8 < iVar2 + -1) {
      iVar3 = iVar8;
    }
    local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [iVar3] = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[iVar3] + 1;
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  do {
    if ((ulong)((long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start) < 0x11) break;
    piVar5 = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start + 1;
    piVar6 = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    piVar7 = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if (piVar5 != local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish &&
        local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      do {
        piVar6 = piVar5;
        if (*piVar7 <= *piVar5) {
          piVar6 = piVar7;
        }
        piVar5 = piVar5 + 1;
        piVar7 = piVar6;
      } while (piVar5 != local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    iVar4 = *piVar6;
    if (8 < iVar4) break;
    lVar9 = (long)piVar6 -
            (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
    pdVar1 = (double *)
             ((long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar9 * 2);
    __src = pdVar1 + 1;
    local_c8 = *pdVar1;
    iVar8 = *piVar6;
    if (__src != local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish) {
      memmove((void *)((long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar9 * 2),__src,
              (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)__src);
    }
    local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish + -1;
    piVar5 = (int *)((long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar9 + 4);
    if (piVar5 != local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      memmove((void *)((long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar9),piVar5,
              (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar5);
    }
    local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish + -1;
    piVar5 = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start + 1;
    piVar6 = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    piVar7 = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if (piVar5 != local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish &&
        local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      do {
        piVar6 = piVar5;
        if (*piVar7 <= *piVar5) {
          piVar6 = piVar7;
        }
        piVar5 = piVar5 + 1;
        piVar7 = piVar6;
      } while (piVar5 != local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    *(double *)
     ((long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start +
     ((long)piVar6 -
     (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start) * 2) =
         local_c8 +
         *(double *)
          ((long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start +
          ((long)piVar6 -
          (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start) * 2);
    *piVar6 = *piVar6 + iVar8;
  } while (iVar4 < 9);
  local_c8 = chi_percentil(&local_f8,&local_e0);
  local_70.m_start = "REQUIRE";
  local_70.m_size = 7;
  local_38.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_38.line = 0x11c;
  Catch::StringRef::StringRef(&local_48,"(0.01 < c2_p and c2_p < 0.99)");
  Catch::AssertionHandler::AssertionHandler(&local_b8,&local_70,&local_38,local_48,Normal);
  local_70.m_start =
       (char *)(CONCAT71(local_70.m_start._1_7_,-(local_c8 < 0.99) & -(0.01 < local_c8)) &
               0xffffffffffffff01);
  Catch::AssertionHandler::handleExpr<bool>(&local_b8,(ExprLhs<bool> *)&local_70);
  Catch::AssertionHandler::complete(&local_b8);
  if (local_b8.m_completed == false) {
    (*(local_b8.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void discrete_dist_test_chi2_test(dist &d) {
  using result_type = typename dist::result_type;
  std::vector<double> p;
  {
    int i{d.min()};
    while (i <= d.max()) {
      p.push_back(d.pdf(i));
      double P{d.cdf(i)};
      if (P > 0.99)
        break;
      ++i;
    }
    if (i < d.max())
      p.push_back(1.0 - d.cdf(i));
  }
  const int bins{static_cast<int>(p.size())};
  const int N{10000};
  std::vector<int> count(bins, 0);
  trng::lcg64_shift R(100ull);
  for (int i{0}; i < N; ++i) {
    const result_type x{d(R) - d.min()};
    int bin{std::min(x, bins - 1)};
    ++count[bin];
  }
  // merge bins with very small count numbers
  while (p.size() > 2) {
    auto min{std::min_element(count.begin(), count.end())};
    if (*min > 8)
      break;
    auto pos{min - count.begin()};
    const double p_old{p[pos]};
    const int count_old{count[pos]};
    p.erase(p.begin() + pos);
    count.erase(count.begin() + pos);
    min = std::min_element(count.begin(), count.end());
    pos = min - count.begin();
    p[pos] += p_old;
    count[pos] += count_old;
  }
  const double c2_p{chi_percentil(p, count)};
  REQUIRE((0.01 < c2_p and c2_p < 0.99));
}